

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSet.cpp
# Opt level: O0

void __thiscall HSet::print(HSet *this)

{
  FILE *pFVar1;
  size_type sVar2;
  const_reference pvVar3;
  uint *puVar4;
  int *in_RDI;
  HighsInt ix_3;
  HighsInt ix_2;
  HighsInt ix_1;
  HighsInt ix;
  HighsInt size;
  int local_1c;
  uint local_18;
  uint local_14;
  int local_10;
  
  if (((*(byte *)(in_RDI + 8) & 1) != 0) && (*(long *)(in_RDI + 10) != 0)) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 2));
    fprintf(*(FILE **)(in_RDI + 10),"\nSet(%d, %d):\n",sVar2 & 0xffffffff,(ulong)(uint)in_RDI[0xc]);
    fprintf(*(FILE **)(in_RDI + 10),"Pointers: Pointers|");
    for (local_10 = 0; local_10 <= in_RDI[0xc]; local_10 = local_10 + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe),(long)local_10);
      if (*pvVar3 != -1) {
        pFVar1 = *(FILE **)(in_RDI + 10);
        puVar4 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe),
                                    (long)local_10);
        fprintf(pFVar1," %4d",(ulong)*puVar4);
      }
    }
    fprintf(*(FILE **)(in_RDI + 10),"\n");
    fprintf(*(FILE **)(in_RDI + 10),"          Entries |");
    for (local_14 = 0; (int)local_14 <= in_RDI[0xc]; local_14 = local_14 + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe),(long)(int)local_14);
      if (*pvVar3 != -1) {
        fprintf(*(FILE **)(in_RDI + 10)," %4d",(ulong)local_14);
      }
    }
    fprintf(*(FILE **)(in_RDI + 10),"\n");
    fprintf(*(FILE **)(in_RDI + 10),"Entries:  Indices |");
    for (local_18 = 0; (int)local_18 < *in_RDI; local_18 = local_18 + 1) {
      fprintf(*(FILE **)(in_RDI + 10)," %4d",(ulong)local_18);
    }
    fprintf(*(FILE **)(in_RDI + 10),"\n");
    fprintf(*(FILE **)(in_RDI + 10),"          Entries |");
    for (local_1c = 0; local_1c < *in_RDI; local_1c = local_1c + 1) {
      pFVar1 = *(FILE **)(in_RDI + 10);
      puVar4 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_1c);
      fprintf(pFVar1," %4d",(ulong)*puVar4);
    }
    fprintf(*(FILE **)(in_RDI + 10),"\n");
  }
  return;
}

Assistant:

void HSet::print() const {
  if (!setup_) return;
  if (log_file_ == NULL) return;
  HighsInt size = entry_.size();
  fprintf(log_file_, "\nSet(%" HIGHSINT_FORMAT ", %" HIGHSINT_FORMAT "):\n",
          size, max_entry_);
  fprintf(log_file_, "Pointers: Pointers|");
  for (HighsInt ix = 0; ix <= max_entry_; ix++) {
    if (pointer_[ix] != no_pointer)
      fprintf(log_file_, " %4" HIGHSINT_FORMAT "", pointer_[ix]);
  }
  fprintf(log_file_, "\n");
  fprintf(log_file_, "          Entries |");
  for (HighsInt ix = 0; ix <= max_entry_; ix++) {
    if (pointer_[ix] != no_pointer)
      fprintf(log_file_, " %4" HIGHSINT_FORMAT "", ix);
  }
  fprintf(log_file_, "\n");
  fprintf(log_file_, "Entries:  Indices |");
  for (HighsInt ix = 0; ix < count_; ix++)
    fprintf(log_file_, " %4" HIGHSINT_FORMAT "", ix);
  fprintf(log_file_, "\n");
  fprintf(log_file_, "          Entries |");
  for (HighsInt ix = 0; ix < count_; ix++)
    fprintf(log_file_, " %4" HIGHSINT_FORMAT "", entry_[ix]);
  fprintf(log_file_, "\n");
}